

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O1

Am_Value * __thiscall Am_Value_List::Get_Nth(Am_Value_List *this,int index)

{
  Am_Value_List_Data *pAVar1;
  Am_List_Item *pAVar2;
  ostream *poVar3;
  
  pAVar1 = this->data;
  if (pAVar1 == (Am_Value_List_Data *)0x0) {
    Am_Error("Value list is empty in Get_Nth");
  }
  if (index < (int)(uint)*(ushort *)&(pAVar1->super_Am_Wrapper).field_0xc) {
    pAVar2 = pAVar1->head;
    if (0 < index) {
      do {
        pAVar2 = pAVar2->next;
        index = index + -1;
      } while (index != 0);
    }
    return &pAVar2->super_Am_Value;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar3 = std::operator<<(poVar3,"Value list is too short, len = ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,*(ushort *)&(this->data->super_Am_Wrapper).field_0xc);
  poVar3 = std::operator<<(poVar3," but requested ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,index);
  std::endl<char,std::char_traits<char>>(poVar3);
  Am_Error();
}

Assistant:

Am_Value &
Am_Value_List::Get_Nth(int index) const
{
  if (!data)
    Am_Error("Value list is empty in Get_Nth");
  Am_List_Item *this_item = data->head;
  if (index >= data->number)
    Am_ERROR("Value list is too short, len = " << data->number
                                               << " but requested " << index);
  for (int i = 0; i < index; i++) {
    this_item = this_item->next;
  }
  return *this_item;
}